

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2enc.c
# Opt level: O0

void jpc_restore_t2state(jpc_enc_t *enc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  jpc_enc_tile_t *pjVar5;
  jpc_enc_tcmpt_t *pjVar6;
  jpc_enc_rlvl_t *pjVar7;
  jpc_enc_band_t *pjVar8;
  jpc_enc_cblk_t *pjVar9;
  jpc_enc_prc_t *local_68;
  jpc_enc_prc_t *prc;
  uint prcno;
  jpc_enc_tile_t *tile;
  jpc_enc_cblk_t *endcblks;
  jpc_enc_cblk_t *cblk;
  jpc_enc_band_t *endbands;
  jpc_enc_band_t *band;
  jpc_enc_rlvl_t *endlvls;
  jpc_enc_rlvl_t *lvl;
  jpc_enc_tcmpt_t *endcomps;
  jpc_enc_tcmpt_t *comp;
  jpc_enc_t *enc_local;
  
  pjVar5 = enc->curtile;
  pjVar6 = pjVar5->tcmpts;
  uVar1 = pjVar5->numtcmpts;
  for (endcomps = pjVar5->tcmpts; endcomps != pjVar6 + uVar1; endcomps = endcomps + 1) {
    pjVar7 = endcomps->rlvls;
    uVar2 = endcomps->numrlvls;
    for (endlvls = endcomps->rlvls; endlvls != pjVar7 + uVar2; endlvls = endlvls + 1) {
      if (endlvls->bands != (jpc_enc_band_t *)0x0) {
        pjVar8 = endlvls->bands;
        uVar3 = endlvls->numbands;
        for (endbands = endlvls->bands; endbands != pjVar8 + uVar3; endbands = endbands + 1) {
          if (endbands->data != (jas_matrix_t *)0x0) {
            prc._4_4_ = 0;
            local_68 = endbands->prcs;
            for (; prc._4_4_ < endlvls->numprcs; prc._4_4_ = prc._4_4_ + 1) {
              if (local_68->cblks != (jpc_enc_cblk_t *)0x0) {
                jpc_tagtree_copy(local_68->incltree,local_68->savincltree);
                jpc_tagtree_copy(local_68->nlibtree,local_68->savnlibtree);
                pjVar9 = local_68->cblks;
                uVar4 = local_68->numcblks;
                for (endcblks = local_68->cblks; endcblks != pjVar9 + uVar4; endcblks = endcblks + 1
                    ) {
                  endcblks->curpass = endcblks->savedcurpass;
                  endcblks->numencpasses = endcblks->savednumencpasses;
                  endcblks->numlenbits = endcblks->savednumlenbits;
                }
              }
              local_68 = local_68 + 1;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void jpc_restore_t2state(jpc_enc_t *enc)
{

	jpc_enc_tcmpt_t *comp;
	jpc_enc_tcmpt_t *endcomps;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_rlvl_t *endlvls;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_enc_tile_t *tile;
	unsigned prcno;
	jpc_enc_prc_t *prc;

	tile = enc->curtile;

	endcomps = &tile->tcmpts[tile->numtcmpts];
	for (comp = tile->tcmpts; comp != endcomps; ++comp) {
		endlvls = &comp->rlvls[comp->numrlvls];
		for (lvl = comp->rlvls; lvl != endlvls; ++lvl) {
			if (!lvl->bands) {
				continue;
			}
			endbands = &lvl->bands[lvl->numbands];
			for (band = lvl->bands; band != endbands; ++band) {
				if (!band->data) {
					continue;
				}
				for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs; ++prcno, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					jpc_tagtree_copy(prc->incltree, prc->savincltree);
					jpc_tagtree_copy(prc->nlibtree, prc->savnlibtree);
					endcblks = &prc->cblks[prc->numcblks];
					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						cblk->curpass = cblk->savedcurpass;
						cblk->numencpasses = cblk->savednumencpasses;
						cblk->numlenbits = cblk->savednumlenbits;
					}
				}
			}
		}
	}
}